

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O1

void __thiscall
cppcms::applications_pool::unmount
          (applications_pool *this,weak_ptr<cppcms::application_specific_pool> *wgen)

{
  int iVar1;
  element_type *peVar2;
  _data *this_00;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  iterator __position;
  bool bVar4;
  unique_lock<std::recursive_mutex> lock;
  unique_lock<std::recursive_mutex> local_28;
  
  this_01 = (wgen->super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar3 = this_01->_M_use_count;
    do {
      if (iVar3 == 0) {
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_01->_M_use_count;
      bVar4 = iVar3 == iVar1;
      if (bVar4) {
        this_01->_M_use_count = iVar3 + 1;
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      UNLOCK();
    } while (!bVar4);
  }
  if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar4 = true;
  }
  else {
    bVar4 = this_01->_M_use_count == 0;
  }
  peVar2 = (wgen->super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (!(bool)(peVar2 == (element_type *)0x0 | bVar4)) {
    local_28._M_device = &((this->d).ptr_)->lock;
    local_28._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_28);
    local_28._M_owns = true;
    this_00 = (this->d).ptr_;
    __position._M_node = (_List_node_base *)this_00;
    do {
      __position._M_node =
           (((_data *)__position._M_node)->apps).
           super__List_base<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
           ._M_impl._M_node.super__List_node_base._M_next;
      if ((_data *)__position._M_node == this_00) goto LAB_001d6fde;
    } while ((element_type *)__position._M_node[3]._M_prev != peVar2);
    std::__cxx11::
    list<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
    ::_M_erase(&this_00->apps,__position);
LAB_001d6fde:
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return;
}

Assistant:

void applications_pool::unmount(booster::weak_ptr<application_specific_pool> wgen)
{
	booster::shared_ptr<application_specific_pool> gen = wgen.lock();
	if(!gen) return;
	
	booster::unique_lock<booster::recursive_mutex> lock(d->lock);

	for(std::list<_data::attachment>::iterator it = d->apps.begin();it!=d->apps.end();++it) {
		if(it->pool == gen) {
			d->apps.erase(it);
			return;
		}
	}
}